

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_boost_po::add_to_description<std::__cxx11::string>
          (options_boost_po *this,
          shared_ptr<VW::config::typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *opt,options_description *options_description)

{
  element_type *peVar1;
  pointer pcVar2;
  value_semantic *pvVar3;
  int iVar4;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar5;
  const_iterator cVar6;
  string boost_option_name;
  undefined8 local_48;
  value_semantic *local_40 [2];
  value_semantic local_30 [2];
  
  peVar1 = (opt->
           super___shared_ptr<VW::config::typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  pcVar2 = (peVar1->super_base_option).m_name._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + (peVar1->super_base_option).m_name._M_string_length)
  ;
  iVar4 = std::__cxx11::string::compare
                    ((char *)&(((opt->
                                super___shared_ptr<VW::config::typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->super_base_option).m_short_name);
  if (iVar4 != 0) {
    std::__cxx11::string::append((char *)local_40);
    std::__cxx11::string::_M_append
              ((char *)local_40,
               (ulong)(((opt->
                        super___shared_ptr<VW::config::typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->super_base_option).m_short_name._M_dataplus._M_p);
  }
  local_48 = boost::program_options::options_description::add_options();
  pvVar3 = local_40[0];
  ptVar5 = get_base_boost_value<std::__cxx11::string>(this,opt);
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_48,pvVar3,(char *)ptVar5);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->m_defined_options)._M_t,
                 &(((opt->
                    super___shared_ptr<VW::config::typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->super_base_option).m_name);
  if ((_Rb_tree_header *)cVar6._M_node ==
      &(this->m_defined_options)._M_t._M_impl.super__Rb_tree_header) {
    local_48 = boost::program_options::options_description::add_options();
    pvVar3 = local_40[0];
    ptVar5 = get_base_boost_value<std::__cxx11::string>(this,opt);
    boost::program_options::options_description_easy_init::operator()
              ((char *)&local_48,pvVar3,(char *)ptVar5);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

void options_boost_po::add_to_description(
    std::shared_ptr<typed_option<T>> opt, po::options_description& options_description)
{
  std::string boost_option_name = opt->m_name;
  if (opt->m_short_name != "")
  {
    boost_option_name += ",";
    boost_option_name += opt->m_short_name;
  }
  options_description.add_options()(boost_option_name.c_str(), convert_to_boost_value(opt), opt->m_help.c_str());

  if (m_defined_options.count(opt->m_name) == 0)
  {
    // TODO may need to add noop notifier here.
    master_description.add_options()(boost_option_name.c_str(), convert_to_boost_value(opt), "");
  }
}